

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O2

string * EncodeExtKey_abi_cxx11_(string *__return_storage_ptr__,CExtKey *key)

{
  CChainParams *pCVar1;
  long lVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = Params();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
             pCVar1->base58Prefixes + 4);
  lVar2 = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
          (long)local_40._M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,lVar2 + 0x4a);
  CExtKey::Encode(key,local_40._M_impl.super__Vector_impl_data._M_start + lVar2);
  input.m_size = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40._M_impl.super__Vector_impl_data._M_start;
  input.m_data = local_40._M_impl.super__Vector_impl_data._M_start;
  EncodeBase58Check_abi_cxx11_(__return_storage_ptr__,input);
  memory_cleanse(local_40._M_impl.super__Vector_impl_data._M_start,
                 (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeExtKey(const CExtKey& key)
{
    std::vector<unsigned char> data = Params().Base58Prefix(CChainParams::EXT_SECRET_KEY);
    size_t size = data.size();
    data.resize(size + BIP32_EXTKEY_SIZE);
    key.Encode(data.data() + size);
    std::string ret = EncodeBase58Check(data);
    memory_cleanse(data.data(), data.size());
    return ret;
}